

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Comparison_Test::Body
          (iu_ExpressionNotFail_x_iutest_x_Comparison_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestFlag TVar3;
  TestPartResultReporterInterface *pTVar4;
  TestFlag *pTVar5;
  Variable *pVVar6;
  char *in_R9;
  ScopedSPITestFlag guard;
  size_type __dnew;
  AssertionResult iutest_ar;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_spi_ar;
  TestFlag local_2a8;
  int local_2a4;
  undefined1 local_2a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  AssertionHelper local_278;
  uint local_244;
  long *local_240 [2];
  long local_230 [2];
  char local_220;
  SPIFailureChecker local_218;
  AssertionResult local_1e0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  bool local_198;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(char *)(local_1b8._0_8_ + local_1b8._8_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
  }
  paVar1 = &local_278.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() == 42))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xc6;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x13;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '=';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '2';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000c6;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar2 = &local_1e0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x29;
  iutest::detail::ExpressionLHS<int>::operator!=
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() != 41))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 199;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x13;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '!';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '1';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000c7;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x2b;
  iutest::detail::ExpressionLHS<int>::operator<
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() < 43))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 200;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x12;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '<';
  *(char *)(local_1b8._0_8_ + 0xf) = ' ';
  *(char *)(local_1b8._0_8_ + 0x10) = '4';
  *(char *)(local_1b8._0_8_ + 0x11) = '3';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000c8;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x2b;
  iutest::detail::ExpressionLHS<int>::operator<=
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() <= 43))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xc9;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x13;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '<';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '3';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000c9;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x29;
  iutest::detail::ExpressionLHS<int>::operator>
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() > 41))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xca;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x12;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '>';
  *(char *)(local_1b8._0_8_ + 0xf) = ' ';
  *(char *)(local_1b8._0_8_ + 0x10) = '4';
  *(char *)(local_1b8._0_8_ + 0x11) = '1';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000ca;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 0x29;
  iutest::detail::ExpressionLHS<int>::operator>=
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() >= 41))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xcb;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x13;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '>';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0xf) = '=';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '4';
  *(char *)(local_1b8._0_8_ + 0x12) = '1';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000cb;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_2a4 = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_2a0,&local_2a4);
  local_244 = 1;
  iutest::detail::ExpressionLHS<int>::operator&&
            ((ExpressionResult *)&local_278,(ExpressionLHS<int> *)local_2a0,(int *)&local_244);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() && 1))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xcc;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  TVar3.m_test_flags = local_2a8.m_test_flags;
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = TVar3.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x12;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = '4';
  *(char *)(local_1b8._0_8_ + 0xc) = '2';
  *(char *)(local_1b8._0_8_ + 0xd) = ' ';
  *(char *)(local_1b8._0_8_ + 0xe) = '&';
  *(char *)(local_1b8._0_8_ + 0xf) = '&';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '1';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000cc;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d228;
  local_218.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_2a8);
  local_244 = local_244 & 0xffffff00;
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)local_2a0,(bool *)&local_244);
  local_2a4 = 1;
  iutest::detail::ExpressionLHS<bool>::operator||
            ((ExpressionResult *)&local_278,(ExpressionLHS<bool> *)local_2a0,&local_2a4);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_278,false);
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,local_1b8._0_8_,(pointer)(local_1b8._8_8_ + local_1b8._0_8_));
  local_220 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._8_8_ != &local_288) {
    operator_delete((void *)local_2a0._8_8_,local_288._M_allocated_capacity + 1);
  }
  if (local_220 == '\0') {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_240,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((g() || 1))","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,(char *)local_2a0._0_8_,(allocator<char> *)&local_2a4);
    local_278.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_278.m_part_result.super_iuCodeMessage.m_line = 0xcd;
    local_278.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_278,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_278.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  pTVar5 = iutest::TestFlag::GetInstance();
  pTVar5->m_test_flags = local_2a8.m_test_flags;
  local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)0x15;
  local_1b8._0_8_ = &local_1a8;
  local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_278);
  local_1a8._M_allocated_capacity =
       (size_type)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(undefined8 *)local_1b8._0_8_ = 0x6f69736e61707865;
  *(char *)(local_1b8._0_8_ + 8) = 'n';
  *(char *)(local_1b8._0_8_ + 9) = ':';
  *(char *)(local_1b8._0_8_ + 10) = ' ';
  *(char *)(local_1b8._0_8_ + 0xb) = 'f';
  *(char *)(local_1b8._0_8_ + 0xc) = 'a';
  *(char *)(local_1b8._0_8_ + 0xd) = 'l';
  *(char *)(local_1b8._0_8_ + 0xe) = 's';
  *(char *)(local_1b8._0_8_ + 0xf) = 'e';
  *(char *)(local_1b8._0_8_ + 0xd) = 'l';
  *(char *)(local_1b8._0_8_ + 0xe) = 's';
  *(char *)(local_1b8._0_8_ + 0xf) = 'e';
  *(char *)(local_1b8._0_8_ + 0x10) = ' ';
  *(char *)(local_1b8._0_8_ + 0x11) = '|';
  *(char *)(local_1b8._0_8_ + 0x12) = '|';
  *(char *)(local_1b8._0_8_ + 0x13) = ' ';
  *(char *)(local_1b8._0_8_ + 0x14) = '1';
  local_1b8._8_8_ = local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p;
  *(char *)(local_1b8._0_8_ +
           (long)local_278.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) = '\0';
  iutest::detail::SPIFailureChecker::GetResult(&local_1e0,&local_218,(string *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0015d2a8;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar4 = local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0015d2d0;
  pVVar6 = iutest::TestEnv::get_vars();
  pVVar6->m_testpartresult_reporter = pTVar4;
  if (local_1e0.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,local_1e0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_278);
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x14b0c3;
    local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x1000000cd;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_218,(Fixed *)local_1b8,false);
    if (local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
        super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
        _vptr_TestPartResultReporterInterface !=
        (TestPartResultReporterInterface)
        &local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin) {
      operator_delete((void *)local_218.super_Collector<iutest::detail::NoTestPartResultReporter>.
                              super_NoTestPartResultReporter.super_TestPartResultReporterInterface.
                              _vptr_TestPartResultReporterInterface,
                      (ulong)((long)&(local_218.
                                      super_Collector<iutest::detail::NoTestPartResultReporter>.
                                      m_holder.m_origin)->_vptr_TestPartResultReporterInterface + 1)
                     );
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    local_1e0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Comparison)
{
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() == 42), "expansion: 42 == 42");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() != 41), "expansion: 42 != 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() <  43), "expansion: 42 < 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() <= 43), "expansion: 42 <= 43");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() >  41), "expansion: 42 > 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() >= 41), "expansion: 42 >= 41");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(f() &&  1), "expansion: 42 && 1");
    CHECK_FATAL_FAILURE( IUTEST_ASSERT_NOT(g() ||  1), "expansion: false || 1");
}